

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

int __thiscall
Refal2::
CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::AddKey(CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  _Rb_tree_color _Var1;
  int iVar2;
  CKeyDataPair *pCVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  pStack_48;
  
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<int_&,_true>(&pStack_48,key,&this->size);
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)&this->keyToIndex,&pStack_48);
  std::__cxx11::string::~string((string *)&pStack_48);
  _Var1 = pVar4.first._M_node._M_node[2]._M_color;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    iVar2 = this->size;
    this->size = iVar2 + 1;
    if (this->capacity <= iVar2) {
      grow(this,this->capacity * 2);
    }
    pCVar3 = this->keyDataPairs;
    pCVar3[(int)_Var1].key._M_node = pVar4.first._M_node._M_node;
    pCVar3[(int)_Var1].data._M_t.
    super___uniq_ptr_impl<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>
    ._M_t.
    super__Tuple_impl<0UL,_Refal2::CPreparatoryFunction_*,_std::default_delete<Refal2::CPreparatoryFunction>_>
    .super__Head_base<0UL,_Refal2::CPreparatoryFunction_*,_false>._M_head_impl =
         (CPreparatoryFunction *)0x0;
  }
  return _Var1;
}

Assistant:

int CDictionary<Data, Key>::AddKey( const Key& key )
{
	typedef std::pair<typename CKeyToIndex::iterator, bool> CPair;
	CPair insert = keyToIndex.insert( std::make_pair( key, size ) );
	const int result = insert.first->second;
	if( insert.second ) {
		size++;
		if( capacity < size ) {
			grow( capacity * 2 );
		}
		new( keyDataPairs + result )CKeyDataPair( insert.first );
	}
	return result;
}